

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall
v_hashmap<substring,_features_*>::put_after_get_nogrow
          (v_hashmap<substring,_features_*> *this,substring *key,uint64_t hash,features **val)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  *(undefined1 *)(*(long *)(this + 0x18) + *(long *)(this + 0x38) * 0x28) = 1;
  pcVar2 = key->end;
  puVar1 = (undefined8 *)(*(long *)(this + 0x18) + 8 + *(long *)(this + 0x38) * 0x28);
  *puVar1 = key->begin;
  puVar1[1] = pcVar2;
  *(features **)(*(long *)(this + 0x18) + 0x18 + *(long *)(this + 0x38) * 0x28) = *val;
  *(uint64_t *)(*(long *)(this + 0x18) + 0x20 + *(long *)(this + 0x38) * 0x28) = hash;
  return;
}

Assistant:

T& operator[](size_t i) const { return _begin[i]; }